

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsort.c
# Opt level: O0

sexp_sint_t sexp_object_compare(sexp_conflict ctx,sexp_conflict a,sexp_conflict b,int depth)

{
  sexp psVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int in_ECX;
  sexp in_RDX;
  sexp_conflict in_RSI;
  sexp_conflict in_RDI;
  bool bVar10;
  sexp_sint_t len;
  sexp_sint_t res;
  sexp_sint_t i;
  sexp_conflict ls2;
  sexp_conflict ls1;
  sexp local_68;
  int local_5c;
  ulong local_48;
  long local_40;
  sexp_conflict local_38;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  sexp_conflict ctx_00;
  ulong local_8;
  
  if (in_RSI == in_RDX) {
    local_8 = 0;
  }
  else {
    if (((ulong)in_RSI & 3) == 0) {
      if (((ulong)in_RDX & 3) == 0) {
        if (in_RSI->tag == in_RDX->tag) {
          if (in_ECX < 1) {
            return 0;
          }
          iVar6 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
          switch(in_RSI->tag) {
          case 6:
            local_48 = 0;
            local_38 = (in_RSI->value).type.cpl;
            ctx_00 = in_RSI;
            while( true ) {
              bVar10 = false;
              if (((((local_48 == 0) && (bVar10 = false, in_RSI != local_38)) &&
                   (bVar10 = false, ((ulong)in_RSI & 3) == 0)) &&
                  ((bVar10 = false, in_RSI->tag == 6 && (bVar10 = false, ((ulong)in_RDX & 3) == 0)))
                  ) && ((bVar10 = false, in_RDX->tag == 6 &&
                        (bVar10 = false, ((ulong)in_RDX & 3) == 0)))) {
                bVar10 = in_RDX->tag == 6;
              }
              iVar6 = (int)((ulong)in_RSI >> 0x20);
              if (!bVar10) break;
              local_48 = sexp_object_compare(ctx_00,in_RDX,
                                             (sexp_conflict)
                                             CONCAT44(in_ECX,in_stack_ffffffffffffffd8),iVar6);
              in_RSI = (sexp_conflict)(in_RSI->value).string.offset;
              if ((((((ulong)local_38 & 3) == 0) && (local_38->tag == 6)) &&
                  (((local_38->value).string.offset & 3) == 0)) &&
                 (((local_38->value).type.cpl)->tag == 6)) {
                local_68 = (local_38->value).type.cpl;
              }
              else {
                local_68 = (sexp)0x23e;
              }
              local_38 = local_68;
              in_RDX = (in_RDX->value).type.cpl;
            }
            if (((((ulong)local_38 & 3) == 0) && (local_38->tag == 6)) &&
               ((((ulong)in_RDX & 3) != 0 || (in_RDX->tag != 6)))) {
              local_48 = 1;
            }
            else if (((((ulong)in_RDX & 3) == 0) && (in_RDX->tag == 6)) &&
                    ((((ulong)local_38 & 3) != 0 || (local_38->tag != 6)))) {
              local_48 = 0xffffffffffffffff;
            }
            else if ((in_RSI == (sexp_conflict)0x23e) && (in_RDX == (sexp_conflict)0x23e)) {
              local_48 = 0;
            }
            else if (local_48 == 0) {
              local_48 = sexp_object_compare(ctx_00,in_RDX,
                                             (sexp_conflict)
                                             CONCAT44(in_ECX,in_stack_ffffffffffffffd8),iVar6);
            }
            break;
          case 7:
            iVar6 = strcmp((in_RSI->value).flonum_bits + 8,(in_RDX->value).flonum_bits + 8);
            local_48 = (ulong)iVar6;
            break;
          default:
            local_48 = 0;
            break;
          case 9:
            iVar6 = strcmp((((in_RSI->value).type.name)->value).flonum_bits + 8 +
                           (long)(in_RSI->value).type.cpl,
                           (((in_RDX->value).type.name)->value).flonum_bits + 8 +
                           (long)(in_RDX->value).type.cpl);
            local_48 = (ulong)iVar6;
            break;
          case 10:
            psVar1 = (in_RSI->value).type.name;
            local_48 = (long)psVar1 - (in_RDX->value).stack.length;
            for (local_40 = 0; local_48 == 0 && local_40 < (long)psVar1; local_40 = local_40 + 1) {
              local_48 = sexp_object_compare(in_RSI,in_RDX,
                                             (sexp_conflict)
                                             CONCAT44(in_ECX,in_stack_ffffffffffffffd8),iVar6);
            }
            break;
          case 0xb:
            if ((in_RSI->value).flonum < (in_RDX->value).flonum ||
                (in_RSI->value).flonum == (in_RDX->value).flonum) {
              local_5c = 0;
              if ((in_RSI->value).flonum < (in_RDX->value).flonum) {
                local_5c = -1;
              }
            }
            else {
              local_5c = 1;
            }
            local_48 = (ulong)local_5c;
            break;
          case 0xc:
            local_48 = sexp_bignum_compare(in_RSI,in_RDX);
            break;
          case 0xd:
            uVar7 = sexp_ratio_compare(in_RDI,in_RSI,in_RDX);
            auVar2._8_8_ = (long)uVar7 >> 0x3f;
            auVar2._0_8_ = uVar7 & 0xfffffffffffffffe;
            local_48 = SUB168(auVar2 / SEXT816(2),0);
            break;
          case 0xe:
            local_48 = sexp_object_compare(in_RSI,in_RDX,
                                           (sexp_conflict)CONCAT44(in_ECX,in_stack_ffffffffffffffd8)
                                           ,iVar6);
            if (local_48 == 0) {
              local_48 = sexp_object_compare(in_RSI,in_RDX,
                                             (sexp_conflict)
                                             CONCAT44(in_ECX,in_stack_ffffffffffffffd8),iVar6);
            }
          }
        }
        else if (((((((ulong)in_RSI & 3) == 0) && (in_RSI->tag == 0xb)) ||
                  ((((ulong)in_RSI & 3) == 0 && (in_RSI->tag == 0xc)))) ||
                 ((((ulong)in_RSI & 3) == 0 && (in_RSI->tag == 0xd)))) &&
                (((((ulong)in_RDX & 3) == 0 && (in_RDX->tag == 0xb)) ||
                 (((((ulong)in_RDX & 3) == 0 && (in_RDX->tag == 0xc)) ||
                  ((((ulong)in_RDX & 3) == 0 && (in_RDX->tag == 0xd)))))))) {
          uVar7 = sexp_compare(in_RDI,in_RSI,in_RDX);
          auVar3._8_8_ = (long)uVar7 >> 0x3f;
          auVar3._0_8_ = uVar7 & 0xfffffffffffffffe;
          local_48 = SUB168(auVar3 / SEXT816(2),0);
        }
        else {
          local_48 = (ulong)(in_RSI->tag - in_RDX->tag);
        }
      }
      else if ((((ulong)in_RDX & 1) == 1) &&
              ((((((ulong)in_RSI & 3) == 0 && (in_RSI->tag == 0xb)) ||
                ((((ulong)in_RSI & 3) == 0 && (in_RSI->tag == 0xc)))) ||
               ((((ulong)in_RSI & 3) == 0 && (in_RSI->tag == 0xd)))))) {
        uVar7 = sexp_compare(in_RDI,in_RSI,in_RDX);
        auVar4._8_8_ = (long)uVar7 >> 0x3f;
        auVar4._0_8_ = uVar7 & 0xfffffffffffffffe;
        local_48 = SUB168(auVar4 / SEXT816(2),0);
      }
      else if ((((ulong)in_RDX & 0xf) == 6) && ((((ulong)in_RSI & 3) == 0 && (in_RSI->tag == 7)))) {
        lVar8 = sexp_write_to_string(in_RDI,in_RDX);
        lVar8 = *(long *)(lVar8 + 8);
        lVar9 = sexp_write_to_string(in_RDI,in_RDX);
        iVar6 = strcmp((in_RSI->value).flonum_bits + 8,
                       (char *)(lVar8 + 0x10 + *(long *)(lVar9 + 0x10)));
        local_48 = (ulong)iVar6;
      }
      else {
        local_48 = 1;
      }
    }
    else if (((ulong)in_RDX & 3) == 0) {
      if ((((ulong)in_RSI & 1) == 1) &&
         ((((((ulong)in_RDX & 3) == 0 && (in_RDX->tag == 0xb)) ||
           ((((ulong)in_RDX & 3) == 0 && (in_RDX->tag == 0xc)))) ||
          ((((ulong)in_RDX & 3) == 0 && (in_RDX->tag == 0xd)))))) {
        uVar7 = sexp_compare(in_RDI,in_RSI,in_RDX);
        auVar5._8_8_ = (long)uVar7 >> 0x3f;
        auVar5._0_8_ = uVar7 & 0xfffffffffffffffe;
        local_48 = SUB168(auVar5 / SEXT816(2),0);
      }
      else if ((((ulong)in_RSI & 0xf) == 6) && ((((ulong)in_RDX & 3) == 0 && (in_RDX->tag == 7)))) {
        lVar8 = sexp_write_to_string(in_RDI,in_RSI);
        lVar8 = *(long *)(lVar8 + 8);
        lVar9 = sexp_write_to_string(in_RDI,in_RSI);
        iVar6 = strcmp((char *)(lVar8 + 0x10 + *(long *)(lVar9 + 0x10)),
                       (in_RDX->value).flonum_bits + 8);
        local_48 = (ulong)iVar6;
      }
      else {
        local_48 = 0xffffffffffffffff;
      }
    }
    else {
      if ((((ulong)in_RSI & 0xf) == 6) && (((ulong)in_RDX & 0xf) == 6)) {
        iVar6 = sexp_isymbol_compare(in_RDI,in_RSI,in_RDX);
        return (long)iVar6;
      }
      local_48 = (long)in_RSI - (long)in_RDX;
    }
    local_8 = local_48;
  }
  return local_8;
}

Assistant:

static sexp_sint_t sexp_object_compare (sexp ctx, sexp a, sexp b, int depth) {
  sexp ls1, ls2;
  sexp_sint_t i, res, len;
  if (a == b)
    return 0;
  if (sexp_pointerp(a)) {
    if (sexp_pointerp(b)) {
      if (sexp_pointer_tag(a) == sexp_pointer_tag(b)) {
        if (depth <= 0)
          return 0;
        switch (sexp_pointer_tag(a)) {
#if SEXP_USE_FLONUMS
        case SEXP_FLONUM:
          res = sexp_flonum_value(a) > sexp_flonum_value(b) ? 1 :
                sexp_flonum_value(a) < sexp_flonum_value(b) ? -1 : 0;
          break;
#endif
#if SEXP_USE_BIGNUMS
        case SEXP_BIGNUM:
          res = sexp_bignum_compare(a, b);
          break;
#endif
#if SEXP_USE_RATIOS
        case SEXP_RATIO:
          res = sexp_unbox_fixnum(sexp_ratio_compare(ctx, a, b));
          break;
#endif
#if SEXP_USE_COMPLEX
        case SEXP_COMPLEX:
          res = sexp_object_compare(ctx, sexp_complex_real(a), sexp_complex_real(b), depth-1);
          if (res==0) res = sexp_object_compare(ctx, sexp_complex_imag(a), sexp_complex_imag(b), depth-1);
          break;
#endif
        case SEXP_STRING:
          res = strcmp(sexp_string_data(a), sexp_string_data(b));
          break;
        case SEXP_SYMBOL:
          res = strcmp(sexp_lsymbol_data(a), sexp_lsymbol_data(b));
          break;
        case SEXP_PAIR:
          for (res=0, ls1=a, ls2=sexp_cdr(a); res == 0 && ls1 != ls2 && sexp_pairp(ls1) && sexp_pairp(b) && sexp_pairp(b); ls1=sexp_cdr(ls1), ls2=((sexp_pairp(ls2)&&sexp_pairp(sexp_cdr(ls2)))?sexp_cdr(ls2):SEXP_NULL), b=sexp_cdr(b))
            res = sexp_object_compare(ctx, sexp_car(ls1), sexp_car(b), depth-1);
          if (sexp_pairp(ls2) && !sexp_pairp(b))
            res = 1;
          else if (sexp_pairp(b) && !sexp_pairp(ls2))
            res = -1;
          else if (ls1==SEXP_NULL && b==SEXP_NULL)
            res = 0;
          else if (res == 0)
            res = sexp_object_compare(ctx, ls1, b, depth-1);
          break;
        case SEXP_VECTOR:
          len = sexp_vector_length(a);
          res = len - sexp_vector_length(b);
          for (i=0; res == 0 && i < len; ++i)
            res = sexp_object_compare(ctx, sexp_vector_ref(a, sexp_make_fixnum(i)), sexp_vector_ref(b, sexp_make_fixnum(i)), depth-1);
          break;
        default:
          res = 0;
          break;
        }
      } else if (sexp_non_immediate_ordered_numberp(a) &&
                 sexp_non_immediate_ordered_numberp(b)) {
        res = sexp_unbox_fixnum(sexp_compare(ctx, a, b));
      } else {
        res = sexp_pointer_tag(a) - sexp_pointer_tag(b);
      }
#if SEXP_USE_BIGNUMS || SEXP_USE_FLONUMS
    } else if (sexp_fixnump(b) && sexp_non_immediate_ordered_numberp(a)) {
      res = sexp_unbox_fixnum(sexp_compare(ctx, a, b));
#endif
#if SEXP_USE_HUFF_SYMS
    } else if (sexp_isymbolp(b) && sexp_lsymbolp(a)) {
      res = strcmp(sexp_lsymbol_data(a),
                   sexp_string_data(sexp_write_to_string(ctx, b)));
#endif
    } else {
      res = 1;
    }
  } else if (sexp_pointerp(b)) {
#if SEXP_USE_BIGNUMS || SEXP_USE_FLONUMS
    if (sexp_fixnump(a) && sexp_non_immediate_ordered_numberp(b))
      res = sexp_unbox_fixnum(sexp_compare(ctx, a, b));
    else
#endif
#if SEXP_USE_HUFF_SYMS
    if (sexp_isymbolp(a) && sexp_lsymbolp(b))
      res = strcmp(sexp_string_data(sexp_write_to_string(ctx, a)),
                   sexp_lsymbol_data(b));
    else
#endif
      res = -1;
  } else {
#if SEXP_USE_HUFF_SYMS
    if (sexp_isymbolp(a) && sexp_isymbolp(b))
      return sexp_isymbol_compare(ctx, a, b);
    else
#endif
      res = (sexp_sint_t)a - (sexp_sint_t)b;
  }
  return res;
}